

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowNaiveState::FlushStates(WindowNaiveState *this,WindowAggregatorGlobalState *gsink)

{
  Vector *pVVar1;
  pointer pWVar2;
  AggregateInputData aggr_input_data;
  
  if (this->flush_count != 0) {
    pWVar2 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
             operator->(&(this->super_WindowAggregatorLocalState).cursor);
    DataChunk::Slice(&this->leaves,&pWVar2->chunk,&this->update_sel,this->flush_count,0);
    aggr_input_data.bind_data.ptr = AggregateObject::GetFunctionData(&gsink->aggr);
    aggr_input_data.allocator =
         &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
    aggr_input_data.combine_type = PRESERVE_INPUT;
    pVVar1 = (this->leaves).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    (*(gsink->aggr).function.update)
              (pVVar1,&aggr_input_data,
               ((long)(this->leaves).data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pVVar1) / 0x68,&this->statep,
               this->flush_count);
    this->flush_count = 0;
  }
  return;
}

Assistant:

void WindowNaiveState::FlushStates(const WindowAggregatorGlobalState &gsink) {
	if (!flush_count) {
		return;
	}

	auto &scanned = cursor->chunk;
	leaves.Slice(scanned, update_sel, flush_count);

	const auto &aggr = gsink.aggr;
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), statep, flush_count);

	flush_count = 0;
}